

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

bool __thiscall wasm::ModuleReader::isBinaryFile(ModuleReader *this,string *filename)

{
  bool local_269;
  undefined4 local_25c;
  undefined1 local_258 [4];
  char buffer [4];
  string local_220 [4];
  openmode flags;
  ifstream infile;
  string *filename_local;
  ModuleReader *this_local;
  
  std::ifstream::ifstream(local_220);
  std::operator|(_S_in,_S_bin);
  Path::to_path((PathString *)local_258,filename);
  std::ifstream::open(local_220,(_Ios_Openmode)local_258);
  std::__cxx11::string::~string((string *)local_258);
  local_25c = 0x4030201;
  std::istream::read((char *)local_220,(long)&local_25c);
  std::ifstream::close();
  local_269 = false;
  if ((((char)local_25c == '\0') && (local_269 = false, local_25c._1_1_ == 'a')) &&
     (local_269 = false, local_25c._2_1_ == 's')) {
    local_269 = local_25c._3_1_ == 'm';
  }
  std::ifstream::~ifstream(local_220);
  return local_269;
}

Assistant:

bool ModuleReader::isBinaryFile(std::string filename) {
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in | std::ifstream::binary;
  infile.open(wasm::Path::to_path(filename), flags);
  char buffer[4] = {1, 2, 3, 4};
  infile.read(buffer, 4);
  infile.close();
  return buffer[0] == '\0' && buffer[1] == 'a' && buffer[2] == 's' &&
         buffer[3] == 'm';
}